

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_rightShift_ivec2(ShaderEvalContext *c)

{
  byte bVar1;
  ulong uVar2;
  int i;
  long lVar3;
  Vector<int,_2> res_1;
  Vector<int,_2> res;
  Vector<int,_2> result;
  Vector<float,_2> res_2;
  float local_20 [2];
  ulong local_18;
  int local_8 [2];
  
  local_20[0] = c->in[0].m_data[3];
  local_20[1] = c->in[0].m_data[1];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  lVar3 = 0;
  do {
    res.m_data[lVar3] = (int)local_20[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  uVar2 = *(ulong *)c->in[1].m_data;
  local_18 = uVar2 << 0x20 | uVar2 >> 0x20;
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  lVar3 = 0;
  do {
    res_1.m_data[lVar3] = (int)*(float *)((long)&local_18 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  result.m_data[0] = 0;
  result.m_data[1] = 0;
  lVar3 = 0;
  do {
    bVar1 = (byte)res_1.m_data[lVar3];
    result.m_data[lVar3] =
         res.m_data[lVar3] >> 0x1f & ~(0xffffffffU >> (bVar1 & 0x1f)) |
         res.m_data[lVar3] >> (bVar1 & 0x1f);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar3 = 0;
  do {
    res_2.m_data[lVar3] = (float)result.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_8[0] = 1;
  local_8[1] = 2;
  lVar3 = 0;
  do {
    (c->color).m_data[local_8[lVar3]] = res_2.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }